

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

char * Curl_printable_address(Curl_addrinfo *ai,char *buf,size_t bufsize)

{
  int af;
  char *pcVar1;
  long lVar2;
  
  af = ai->ai_family;
  if (af == 2) {
    lVar2 = 4;
  }
  else {
    if (af != 10) {
      return (char *)0x0;
    }
    lVar2 = 8;
  }
  pcVar1 = Curl_inet_ntop(af,ai->ai_addr->sa_data + lVar2 + -2,buf,bufsize);
  return pcVar1;
}

Assistant:

const char *
Curl_printable_address(const Curl_addrinfo *ai, char *buf, size_t bufsize)
{
  const struct sockaddr_in *sa4;
  const struct in_addr *ipaddr4;
#ifdef ENABLE_IPV6
  const struct sockaddr_in6 *sa6;
  const struct in6_addr *ipaddr6;
#endif

  switch(ai->ai_family) {
    case AF_INET:
      sa4 = (const void *)ai->ai_addr;
      ipaddr4 = &sa4->sin_addr;
      return Curl_inet_ntop(ai->ai_family, (const void *)ipaddr4, buf,
                            bufsize);
#ifdef ENABLE_IPV6
    case AF_INET6:
      sa6 = (const void *)ai->ai_addr;
      ipaddr6 = &sa6->sin6_addr;
      return Curl_inet_ntop(ai->ai_family, (const void *)ipaddr6, buf,
                            bufsize);
#endif
    default:
      break;
  }
  return NULL;
}